

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O0

void __thiscall
AixLog::SinkFormat::do_log(SinkFormat *this,ostream *stream,Metadata *metadata,string *message)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  char *pcVar4;
  string *in_RCX;
  long in_RDX;
  ostream *in_RSI;
  long in_RDI;
  stringstream ss;
  size_t pos;
  string result;
  TextColor *in_stack_fffffffffffffc88;
  ostream *in_stack_fffffffffffffc90;
  allocator<char> *in_stack_fffffffffffffcc0;
  allocator<char> *__a;
  char *in_stack_fffffffffffffcc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcd0;
  bool local_2e2;
  allocator<char> local_2e1;
  string local_2e0 [38];
  byte local_2ba;
  undefined1 local_2b9 [39];
  byte local_292;
  allocator<char> local_291;
  string local_290 [32];
  string local_270 [32];
  TextColor local_250;
  string local_248 [32];
  TextColor local_228;
  stringstream local_220 [112];
  string *in_stack_fffffffffffffe50;
  Timestamp *in_stack_fffffffffffffe58;
  Severity in_stack_fffffffffffffe7f;
  string local_98 [32];
  char *local_78;
  string local_60 [32];
  string local_40 [32];
  string *local_20;
  long local_18;
  ostream *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string(local_40,(string *)(in_RDI + 0x38));
  bVar1 = Timestamp::operator_cast_to_bool((Timestamp *)(local_18 + 0x90));
  if (bVar1) {
    Timestamp::to_string(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    std::__cxx11::string::operator=(local_40,local_60);
    std::__cxx11::string::~string(local_60);
  }
  uVar2 = std::__cxx11::string::find((char *)local_40,0x2ca60f);
  local_78 = (char *)uVar2;
  if (uVar2 != 0xffffffffffffffff) {
    to_string_abi_cxx11_(in_stack_fffffffffffffe7f);
    std::__cxx11::string::replace((ulong)local_40,uVar2,(string *)0x9);
    std::__cxx11::string::~string(local_98);
  }
  local_78 = (char *)std::__cxx11::string::find((char *)local_40,0x2ca619);
  if (local_78 != (char *)0xffffffffffffffff) {
    std::__cxx11::stringstream::stringstream(local_220);
    TextColor::TextColor(&local_228,RED,NONE);
    poVar3 = AixLog::operator<<(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    to_string_abi_cxx11_(in_stack_fffffffffffffe7f);
    std::operator<<(poVar3,local_248);
    TextColor::TextColor(&local_250,NONE,NONE);
    AixLog::operator<<(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    std::__cxx11::string::~string(local_248);
    pcVar4 = local_78;
    std::__cxx11::stringstream::str();
    std::__cxx11::string::replace((ulong)local_40,(ulong)pcVar4,(string *)0xf);
    std::__cxx11::string::~string(local_270);
    std::__cxx11::stringstream::~stringstream(local_220);
  }
  uVar2 = std::__cxx11::string::find((char *)local_40,0x2ca629);
  local_78 = (char *)uVar2;
  if (uVar2 != 0xffffffffffffffff) {
    bVar1 = Tag::operator_cast_to_bool((Tag *)(local_18 + 8));
    local_292 = 0;
    if (bVar1) {
      std::__cxx11::string::string(local_290,(string *)(local_18 + 0x10));
    }
    else {
      bVar1 = Function::operator_cast_to_bool((Function *)(local_18 + 0x38));
      if (bVar1) {
        std::__cxx11::string::string(local_290,(string *)(local_18 + 0x40));
      }
      else {
        std::allocator<char>::allocator();
        local_292 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
      }
    }
    std::__cxx11::string::replace((ulong)local_40,uVar2,(string *)0x9);
    std::__cxx11::string::~string(local_290);
    if ((local_292 & 1) != 0) {
      std::allocator<char>::~allocator(&local_291);
    }
  }
  uVar2 = std::__cxx11::string::find((char *)local_40,0x2ca633);
  local_78 = (char *)uVar2;
  if (uVar2 != 0xffffffffffffffff) {
    bVar1 = Tag::operator_cast_to_bool((Tag *)(local_18 + 8));
    local_2ba = 0;
    if (bVar1) {
      std::__cxx11::string::string((string *)(local_2b9 + 1),(string *)(local_18 + 0x10));
    }
    else {
      in_stack_fffffffffffffcd0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b9;
      std::allocator<char>::allocator();
      local_2ba = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
    }
    std::__cxx11::string::replace((ulong)local_40,uVar2,(string *)0x4);
    std::__cxx11::string::~string((string *)(local_2b9 + 1));
    if ((local_2ba & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)local_2b9);
    }
  }
  pcVar4 = (char *)std::__cxx11::string::find((char *)local_40,0x2ca638);
  local_78 = pcVar4;
  if (pcVar4 != (char *)0xffffffffffffffff) {
    local_2e2 = Function::operator_cast_to_bool((Function *)(local_18 + 0x38));
    if (local_2e2) {
      std::__cxx11::string::string(local_2e0,(string *)(local_18 + 0x40));
    }
    else {
      __a = &local_2e1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(in_stack_fffffffffffffcd0,pcVar4,__a);
    }
    local_2e2 = !local_2e2;
    std::__cxx11::string::replace((ulong)local_40,(ulong)pcVar4,(string *)0x9);
    std::__cxx11::string::~string(local_2e0);
    if (local_2e2) {
      std::allocator<char>::~allocator(&local_2e1);
    }
  }
  local_78 = (char *)std::__cxx11::string::find((char *)local_40,0x2ca642);
  if (local_78 == (char *)0xffffffffffffffff) {
    uVar2 = std::__cxx11::string::empty();
    if (((uVar2 & 1) == 0) && (pcVar4 = (char *)std::__cxx11::string::back(), *pcVar4 != ' ')) {
      poVar3 = std::operator<<(local_10,local_40);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = std::operator<<(poVar3,local_20);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar3 = std::operator<<(local_10,local_40);
      poVar3 = std::operator<<(poVar3,local_20);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    std::__cxx11::string::replace((ulong)local_40,(ulong)local_78,(string *)0x8);
    poVar3 = std::operator<<(local_10,local_40);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

virtual void do_log(std::ostream& stream, const Metadata& metadata,
                      const std::string& message) const {
    std::string result = format_;
    if (metadata.timestamp) result = metadata.timestamp.to_string(result);

    size_t pos = result.find("#severity");
    if (pos != std::string::npos)
      result.replace(pos, 9, to_string(metadata.severity));

    pos = result.find("#color_severity");
    if (pos != std::string::npos) {
      std::stringstream ss;
      ss << TextColor(Color::RED) << to_string(metadata.severity)
         << TextColor(Color::NONE);
      result.replace(pos, 15, ss.str());
    }

    pos = result.find("#tag_func");
    if (pos != std::string::npos)
      result.replace(
          pos, 9,
          metadata.tag ? metadata.tag.text
                       : (metadata.function ? metadata.function.name : "log"));

    pos = result.find("#tag");
    if (pos != std::string::npos)
      result.replace(pos, 4, metadata.tag ? metadata.tag.text : "");

    pos = result.find("#function");
    if (pos != std::string::npos)
      result.replace(pos, 9, metadata.function ? metadata.function.name : "");

    pos = result.find("#message");
    if (pos != std::string::npos) {
      result.replace(pos, 8, message);
      stream << result << std::endl;
    } else {
      if (result.empty() || (result.back() == ' '))
        stream << result << message << std::endl;
      else
        stream << result << " " << message << std::endl;
    }
  }